

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::logKernelInfo(CLIntercept *this,cl_kernel *kernels,cl_uint numKernels)

{
  cl_kernel p_Var1;
  cl_device_id *pp_Var2;
  _Alloc_hider _Var3;
  byte bVar4;
  int iVar5;
  cl_int cVar6;
  cl_int cVar7;
  cl_int cVar8;
  uint uVar9;
  long *plVar10;
  undefined8 uVar11;
  long *plVar12;
  ulong uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  float __x;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar16;
  cl_uint numDevices;
  cl_uint regCount;
  cl_uint args;
  cl_device_id *deviceList;
  size_t rwgs [3];
  cl_ulong sms;
  cl_ulong lms;
  cl_ulong pms;
  size_t wgs;
  size_t pwgsm;
  char *deviceName;
  cl_program program;
  cl_uint local_11c [3];
  pthread_mutex_t *local_110;
  cl_device_id *local_108;
  cl_int local_100;
  cl_int local_fc;
  cl_int local_f8;
  cl_int local_f4;
  cl_int local_f0;
  cl_int local_ec;
  long *local_e8;
  long lStack_e0;
  long local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  cl_kernel *local_a0;
  ulong local_98;
  cl_device_id *local_90;
  cl_kernel local_88;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cl_program local_58;
  string local_50;
  
  if (numKernels != 0) {
    local_110 = (pthread_mutex_t *)&this->m_Mutex;
    iVar5 = pthread_mutex_lock(local_110);
    if (iVar5 != 0) {
      uVar11 = std::__throw_system_error(iVar5);
      pthread_mutex_unlock(local_110);
      _Unwind_Resume(uVar11);
    }
    local_58 = (cl_program)0x0;
    cVar6 = (*(this->m_Dispatch).clGetKernelInfo)(*kernels,0x1194,8,&local_58,(size_t *)0x0);
    local_11c[0] = 0;
    local_108 = (cl_device_id *)0x0;
    if (cVar6 == 0) {
      allocateAndGetProgramDeviceList(this,local_58,local_11c,&local_108);
      if (local_11c[0] != 0) {
        uVar13 = (ulong)numKernels;
        local_a0 = kernels;
        do {
          if (uVar13 == 0) break;
          p_Var1 = kernels[uVar13 - 1];
          local_98 = uVar13 - 1;
          getShortKernelNameWithHash_abi_cxx11_(&local_50,this,p_Var1);
          std::operator+(&local_78,"Kernel Info for: ",&local_50);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_78);
          plVar12 = plVar10 + 2;
          if ((long *)*plVar10 == plVar12) {
            uVar14 = (undefined4)*plVar12;
            uVar16 = *(undefined4 *)((long)plVar10 + 0x14);
            local_d8 = *plVar12;
            uStack_d0 = (undefined4)plVar10[3];
            uStack_cc = *(undefined4 *)((long)plVar10 + 0x1c);
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar12;
            uVar14 = extraout_XMM0_Da;
            uVar16 = extraout_XMM0_Db;
            local_e8 = (long *)*plVar10;
          }
          lStack_e0 = plVar10[1];
          *plVar10 = (long)plVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          log(this,(double)CONCAT44(uVar16,uVar14));
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (local_11c[0] == 0) {
            uVar9 = 0;
          }
          else {
            uVar13 = 0;
            local_90 = local_108;
            local_88 = p_Var1;
            do {
              p_Var1 = local_88;
              pp_Var2 = local_90;
              local_78._M_dataplus._M_p = (pointer)0x0;
              cVar6 = allocateAndGetDeviceInfoString
                                (this,local_90[uVar13],0x102b,(char **)&local_78);
              local_11c[2] = 0;
              cVar7 = (*(this->m_Dispatch).clGetKernelInfo)
                                (p_Var1,0x1191,4,local_11c + 2,(size_t *)0x0);
              local_a8 = 0;
              local_ec = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                   (p_Var1,pp_Var2[uVar13],0x11b3,8,&local_a8,(size_t *)0x0);
              local_b0 = 0;
              local_f0 = cVar7;
              local_f4 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                   (p_Var1,pp_Var2[uVar13],0x11b0,8,&local_b0,(size_t *)0x0);
              local_e8 = (long *)0x0;
              lStack_e0 = 0;
              local_d8 = 0;
              cVar7 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                (p_Var1,pp_Var2[uVar13],0x11b1,0x18,&local_e8,(size_t *)0x0);
              local_b8 = 0;
              local_f8 = cVar6;
              local_fc = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                   (p_Var1,pp_Var2[uVar13],0x11b4,8,&local_b8,(size_t *)0x0);
              local_c0 = 0;
              cVar6 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                (p_Var1,pp_Var2[uVar13],0x11b2,8,&local_c0,(size_t *)0x0);
              local_c8 = 0;
              local_100 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                    (p_Var1,pp_Var2[uVar13],0x4109,8,&local_c8,(size_t *)0x0);
              local_11c[1] = 0;
              local_80 = uVar13;
              cVar8 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                (p_Var1,pp_Var2[uVar13],0x425b,4,local_11c + 1,(size_t *)0x0);
              _Var3._M_p = local_78._M_dataplus._M_p;
              if (((cVar7 == 0 && local_fc == 0) && cVar6 == 0) &&
                  ((local_ec == 0 && local_f4 == 0) && (local_f0 == 0 && local_f8 == 0))) {
                fVar15 = logf(this,__x);
                bVar4 = (this->m_Config).KernelInfoLogging;
                if ((bool)bVar4 == true) {
                  fVar15 = logf(this,fVar15);
                  bVar4 = (this->m_Config).KernelInfoLogging;
                }
                if (((bVar4 & 1) != 0) ||
                   ((this->m_Config).PreferredWorkGroupSizeMultipleLogging == true)) {
                  fVar15 = logf(this,fVar15);
                  bVar4 = (this->m_Config).KernelInfoLogging;
                }
                if ((bVar4 & 1) != 0) {
                  fVar15 = logf(this,fVar15);
                  if ((local_e8 != (long *)0x0 || lStack_e0 != 0) || local_d8 != 0) {
                    fVar15 = logf(this,fVar15);
                  }
                  fVar15 = logf(this,fVar15);
                  fVar15 = logf(this,fVar15);
                  if (local_100 == 0) {
                    fVar15 = logf(this,fVar15);
                  }
                  if (cVar8 == 0) {
                    logf(this,fVar15);
                  }
                }
                if (_Var3._M_p != (pointer)0x0) goto LAB_0016ebfa;
              }
              else if (local_78._M_dataplus._M_p == (pointer)0x0) {
                logf(this,__x);
              }
              else {
                logf(this,__x);
LAB_0016ebfa:
                operator_delete__(_Var3._M_p);
              }
              uVar13 = local_80 + 1;
              kernels = local_a0;
              uVar9 = local_11c[0];
            } while (uVar13 < local_11c[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
            uVar9 = local_11c[0];
          }
          uVar13 = local_98;
        } while (uVar9 != 0);
      }
      if (local_108 != (cl_device_id *)0x0) {
        operator_delete__(local_108);
      }
    }
    pthread_mutex_unlock(local_110);
  }
  return;
}

Assistant:

void CLIntercept::logKernelInfo(
    const cl_kernel* kernels,
    cl_uint numKernels )
{
    if( numKernels > 0 )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;

        // We can share the program and device list for all kernels.

        cl_kernel   queryKernel = kernels[0];

        // First, get the program for this kernel.
        cl_program  program = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetKernelInfo(
                queryKernel,
                CL_KERNEL_PROGRAM,
                sizeof(program),
                &program,
                NULL );
        }

        // Next, get the list of devices for the program.
        cl_uint         numDevices = 0;
        cl_device_id*   deviceList = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = allocateAndGetProgramDeviceList(
                program,
                numDevices,
                deviceList );
        }

        // Log the preferred work group size multiple for each kernel,
        // for each device.
        while( numDevices && numKernels-- )
        {
            cl_kernel   kernel = kernels[ numKernels ];

            const std::string& kernelName = getShortKernelNameWithHash(kernel);
            log( "Kernel Info for: " + kernelName + "\n" );

            for( cl_uint i = 0; i < numDevices; i++ )
            {
                char*   deviceName = NULL;
                errorCode = allocateAndGetDeviceInfoString(
                    deviceList[i],
                    CL_DEVICE_NAME,
                    deviceName );

                cl_uint args = 0;
                errorCode |= dispatch().clGetKernelInfo(
                    kernel,
                    CL_KERNEL_NUM_ARGS,
                    sizeof(args),
                    &args,
                    NULL );

                size_t  pwgsm = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );
                size_t  wgs = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_WORK_GROUP_SIZE,
                    sizeof(wgs),
                    &wgs,
                    NULL );
                size_t  rwgs[3] = {0, 0, 0};
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_COMPILE_WORK_GROUP_SIZE,
                    sizeof(rwgs),
                    rwgs,
                    NULL );
                cl_ulong pms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(pms),
                    &pms,
                    NULL );
                cl_ulong lms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(lms),
                    &lms,
                    NULL );
                cl_ulong sms = 0;
                cl_int errorCode_sms = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(sms),
                    &sms,
                    NULL );
                cl_uint regCount = 0;
                cl_int errorCode_regCount = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( errorCode == CL_SUCCESS )
                {
                    logf( "    For device: %s\n",
                        deviceName );
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Num Args: %u\n", args);
                    }
                    if( config().KernelInfoLogging ||
                        config().PreferredWorkGroupSizeMultipleLogging )
                    {
                        logf( "        Preferred Work Group Size Multiple: %zu\n", pwgsm);
                    }
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Max Work Group Size: %zu\n", wgs);
                        if( rwgs[0] != 0 || rwgs[1] != 0 || rwgs[2] != 0 )
                        {
                            logf( "        Required Work Group Size: < %zu, %zu, %zu >\n",
                                rwgs[0], rwgs[1], rwgs[2]);
                        }
                        logf( "        Private Mem Size: %u\n", (cl_uint)pms);
                        logf( "        Local Mem Size: %u\n", (cl_uint)lms);
                        if( errorCode_sms == CL_SUCCESS )
                        {
                            logf( "        Spill Mem Size: %u\n", (cl_uint)sms);
                        }
                        if( errorCode_regCount == CL_SUCCESS )
                        {
                            logf( "        Register Count: %u\n", regCount);
                        }
                    }
                }
                else if( deviceName )
                {
                    logf( "Error querying kernel info for device %s!\n", deviceName );
                }
                else
                {
                    logf( "Error querying kernel info!\n" );
                }

                delete [] deviceName;
            }
        }

        delete [] deviceList;
    }
}